

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O3

bool __thiscall OpenMD::SelectionCompiler::compileExpression(SelectionCompiler *this,int itoken)

{
  vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *this_00;
  bool bVar1;
  long lVar2;
  
  this_00 = &this->ltokenPostfix;
  std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::_M_erase_at_end
            (this_00,(this->ltokenPostfix).
                     super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>._M_impl.
                     super__Vector_impl_data._M_start);
  if (0 < itoken) {
    lVar2 = 0;
    do {
      std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::push_back
                (this_00,(value_type *)
                         ((long)&((this->atokenCommand).
                                  super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->tok + lVar2));
      lVar2 = lVar2 + 0x18;
    } while ((ulong)(uint)itoken * 0x18 != lVar2);
  }
  std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::operator=
            (&this->atokenInfix,&this->atokenCommand);
  this->itokenInfix = (long)itoken;
  std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::push_back
            (this_00,(value_type *)Token::tokenExpressionBegin);
  bVar1 = clauseOr(this);
  if (bVar1) {
    std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::push_back
              (this_00,(value_type *)Token::tokenExpressionEnd);
    if (this->itokenInfix !=
        ((long)(this->atokenInfix).super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->atokenInfix).super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555) {
      bVar1 = endOfExpressionExpected(this);
      return bVar1;
    }
    std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::operator=
              (&this->atokenCommand,this_00);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool SelectionCompiler::compileExpression(int itoken) {
    ltokenPostfix.clear();
    for (int i = 0; i < itoken; ++i) {
      addTokenToPostfix(atokenCommand[i]);
    }

    atokenInfix = atokenCommand;
    itokenInfix = itoken;

    addTokenToPostfix(Token::tokenExpressionBegin);
    if (!clauseOr()) { return false; }

    addTokenToPostfix(Token::tokenExpressionEnd);
    if (itokenInfix != atokenInfix.size()) { return endOfExpressionExpected(); }

    atokenCommand = ltokenPostfix;
    return true;
  }